

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_data_large.c
# Opt level: O3

void test_read_data_large(void)

{
  int iVar1;
  int iVar2;
  archive *paVar3;
  archive_entry *entry;
  char *pcVar4;
  la_ssize_t v2;
  FILE *__stream;
  size_t v2_00;
  archive_entry *ae;
  size_t used;
  archive_entry *local_40;
  size_t local_38;
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'6',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'7',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'8',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff1,11000000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'9',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff1, sizeof(buff1), &used)",paVar3);
  entry = archive_entry_new();
  local_40 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'>',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81ed);
  fill_with_pseudorandom_data(buff2,10000000);
  archive_entry_set_size(entry,10000000);
  iVar1 = archive_write_header(paVar3,entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'C',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar3);
  archive_entry_free(entry);
  pcVar4 = (char *)archive_write_data(paVar3,buff2,10000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'E',(uint)(pcVar4 == buff1 + 0x64f8d0),
                   "(int)sizeof(buff2) == archive_write_data(a, buff2, sizeof(buff2))",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'L',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'M',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff1,11000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'O',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff1, sizeof(buff1))"
                   ,paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'P',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
  failure("Wrote 10MB, but didn\'t read the same amount");
  v2 = archive_read_data(paVar3,buff3,10000000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'R',10000000,"sizeof(buff2)",v2,"archive_read_data(a, buff3, sizeof(buff3))"
                      ,paVar3);
  failure("Read expected 10MB, but data read didn\'t match what was written");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'T',buff2,"buff2",buff3,"buff3",10000000,"sizeof(buff3)",(void *)0x0);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'Y',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'Z',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'[',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff1,11000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'\\',(uint)(iVar1 == 0),
                   "0 == archive_read_open_memory(a, buff1, sizeof(buff1))",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L']',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
  iVar1 = open("largefile",0x41,0x1ff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'c',(uint)(iVar1 != 0),"tmpfilefd != 0",(void *)0x0);
  iVar2 = archive_read_data_into_fd(paVar3,iVar1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'd',0,"0",(long)iVar2,"archive_read_data_into_fd(a, tmpfilefd)",paVar3);
  iVar2 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar3);
  iVar2 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  close(iVar1);
  __stream = fopen("largefile","rb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'j',(uint)(__stream != (FILE *)0x0),"f != NULL",(void *)0x0);
  v2_00 = fread(buff3,1,10000000,__stream);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'k',10000000,"sizeof(buff3)",v2_00,"fread(buff3, 1, sizeof(buff3), f)",
                      (void *)0x0);
  fclose(__stream);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'm',buff2,"buff2",buff3,"buff3",10000000,"sizeof(buff3)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_data_large)
{
	struct archive_entry *ae;
	struct archive *a;
	char tmpfilename[] = "largefile";
	int tmpfilefd;
	FILE *f;
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff1, sizeof(buff1), &used));

	/*
	 * Write a file (with random contents) to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	fill_with_pseudorandom_data(buff2, sizeof(buff2));
	archive_entry_set_size(ae, sizeof(buff2));
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	assertA((int)sizeof(buff2) == archive_write_data(a, buff2, sizeof(buff2)));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Check that archive_read_data can handle 10*10^6 at a pop. */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff1, sizeof(buff1)));
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Wrote 10MB, but didn't read the same amount");
	assertEqualIntA(a, sizeof(buff2),archive_read_data(a, buff3, sizeof(buff3)));
	failure("Read expected 10MB, but data read didn't match what was written");
	assertEqualMem(buff2, buff3, sizeof(buff3));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Check archive_read_data_into_fd */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff1, sizeof(buff1)));
	assertA(0 == archive_read_next_header(a, &ae));
#if defined(__BORLANDC__)
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY);
#else
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY, 0777);
#endif
	assert(tmpfilefd != 0);
	assertEqualIntA(a, 0, archive_read_data_into_fd(a, tmpfilefd));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	close(tmpfilefd);

	f = fopen(tmpfilename, "rb");
	assert(f != NULL);
	assertEqualInt(sizeof(buff3), fread(buff3, 1, sizeof(buff3), f));
	fclose(f);
	assertEqualMem(buff2, buff3, sizeof(buff3));
}